

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int combine_substitute(gen_ctx_t gen_ctx,bb_insn_t_conflict *bb_insn_ref,long *deleted_insns_num)

{
  undefined8 *puVar1;
  anon_union_32_12_57d33f68_for_u *paVar2;
  undefined1 auVar3 [32];
  anon_union_32_12_57d33f68_for_u aVar4;
  char cVar5;
  MIR_reg_t MVar6;
  VARR_MIR_op_t *pVVar7;
  combine_ctx *pcVar8;
  bitmap_t pVVar9;
  VARR_size_t *pVVar10;
  MIR_op_t *pMVar11;
  MIR_label_t pMVar12;
  long lVar13;
  bool bVar14;
  void *pvVar15;
  undefined8 uVar16;
  int64_t iVar17;
  char *pcVar18;
  char *pcVar19;
  undefined8 uVar20;
  MIR_disp_t MVar21;
  MIR_insn_t insn;
  bb_insn_t_conflict *ppbVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  MIR_op_t *pMVar26;
  MIR_insn_t pMVar27;
  VARR_MIR_reg_t *pVVar28;
  size_t *psVar29;
  int *piVar30;
  long extraout_RDX;
  MIR_reg_t *pMVar31;
  MIR_insn_t_conflict __size;
  gen_ctx_t pgVar32;
  long lVar33;
  size_t sVar34;
  size_t sVar35;
  MIR_insn_t pMVar36;
  int out_p;
  MIR_reg_t early_clobbered_hard_reg2;
  MIR_reg_t early_clobbered_hard_reg1;
  MIR_op_t saved_op;
  char cStack_d0;
  int local_cc;
  bb_insn_t_conflict local_c8;
  ulong local_c0;
  undefined8 local_b8;
  bb_insn_t_conflict *local_b0;
  MIR_reg_t local_a8;
  MIR_reg_t local_a4;
  long *local_a0;
  MIR_op_t *local_98;
  ulong local_90;
  gen_ctx_t local_88;
  MIR_reg_t *local_80;
  MIR_insn_t local_78;
  gen_ctx_t local_70;
  void *pvStack_68;
  undefined8 uStack_60;
  int64_t local_58;
  char *pcStack_50;
  undefined8 uStack_48;
  MIR_disp_t MStack_40;
  
  local_c8 = *bb_insn_ref;
  pMVar36 = local_c8->insn;
  uVar25 = 0;
  local_c0 = *(ulong *)&pMVar36->field_0x18 >> 0x20;
  if (local_c0 == 0) goto LAB_001731a4;
  pVVar7 = gen_ctx->combine_ctx->last_right_ops;
  local_b8 = pMVar36;
  if ((pVVar7 == (VARR_MIR_op_t *)0x0) || (pVVar7->varr == (MIR_op_t *)0x0)) {
LAB_00173980:
    combine_substitute_cold_13();
    __size = (MIR_insn_t_conflict)bb_insn_ref;
    pgVar32 = gen_ctx;
LAB_00173985:
    combine_substitute_cold_11();
LAB_0017398d:
    combine_substitute_cold_10();
  }
  else {
    local_88 = (gen_ctx_t)gen_ctx->ctx;
    pVVar7->els_num = 0;
    lVar13 = local_c0 * 0x30;
    lVar33 = 0;
    __size = (MIR_insn_t_conflict)bb_insn_ref;
    local_a0 = deleted_insns_num;
    do {
      pVVar7 = gen_ctx->combine_ctx->last_right_ops;
      puVar1 = (undefined8 *)((long)&pMVar36->ops[0].data + lVar33);
      pvStack_68 = (void *)*puVar1;
      uStack_60 = puVar1[1];
      local_58 = puVar1[2];
      pcStack_50 = (char *)puVar1[3];
      uStack_48 = *(undefined8 *)((long)&pMVar36->ops[0].u + lVar33 + 0x10);
      MStack_40 = *(undefined8 *)((long)&pMVar36->ops[0].u + lVar33 + 0x18);
      pgVar32 = (gen_ctx_t)pVVar7->varr;
      if (pgVar32 == (gen_ctx_t)0x0) {
        combine_substitute_cold_12();
        goto LAB_00173929;
      }
      uVar25 = pVVar7->els_num + 1;
      if (pVVar7->size < uVar25) {
        sVar35 = (uVar25 >> 1) + uVar25;
        __size = (MIR_insn_t_conflict)(sVar35 * 0x30);
        pMVar26 = (MIR_op_t *)realloc(pgVar32,(size_t)__size);
        pVVar7->varr = pMVar26;
        pVVar7->size = sVar35;
        pMVar36 = local_b8;
      }
      sVar35 = pVVar7->els_num;
      pMVar26 = pVVar7->varr;
      pVVar7->els_num = sVar35 + 1;
      auVar3._8_8_ = uStack_60;
      auVar3._0_8_ = pvStack_68;
      auVar3._16_8_ = local_58;
      auVar3._24_8_ = pcStack_50;
      aVar4.str.s = pcStack_50;
      aVar4.i = local_58;
      aVar4._16_8_ = uStack_48;
      aVar4.mem.disp = MStack_40;
      pMVar26[sVar35].u = aVar4;
      *(undefined1 (*) [32])(pMVar26 + sVar35) = auVar3;
      lVar33 = lVar33 + 0x30;
    } while (lVar13 != lVar33);
    pcVar8 = gen_ctx->combine_ctx;
    pVVar28 = pcVar8->insn_vars;
    if ((pVVar28 == (VARR_MIR_reg_t *)0x0) || (pVVar28->varr == (MIR_reg_t *)0x0))
    goto LAB_00173985;
    pVVar28->els_num = 0;
    pVVar9 = pcVar8->vars_bitmap;
    local_b0 = bb_insn_ref;
    if ((pVVar9 == (bitmap_t)0x0) || (pVVar9->varr == (bitmap_el_t *)0x0)) goto LAB_0017398d;
    pVVar9->els_num = 0;
    sVar34 = local_c0 + (local_c0 == 0);
    pMVar31 = &pMVar36->ops[0].u.mem.index;
    sVar35 = 0;
    do {
      __size = pMVar36;
      pgVar32 = local_88;
      MIR_insn_op_mode((MIR_context_t)local_88,pMVar36,sVar35,&local_cc);
      if ((local_cc == 0) && (cVar5 = (char)pMVar31[-7], cVar5 != '\v')) {
        if (cVar5 == '\v') {
          if (pMVar31[-1] != 0xffffffff) {
            pgVar32 = gen_ctx;
            combine_process_var(gen_ctx,pMVar31[-1],local_c8);
          }
          __size = (MIR_insn_t_conflict)(ulong)*pMVar31;
          if (*pMVar31 != 0xffffffff) goto LAB_0017336b;
        }
        else if (cVar5 == '\x02') {
          __size = (MIR_insn_t_conflict)(ulong)*(uint *)(pMVar31 + -5);
LAB_0017336b:
          pgVar32 = gen_ctx;
          combine_process_var(gen_ctx,(MIR_reg_t)__size,local_c8);
        }
      }
      sVar35 = sVar35 + 1;
      pMVar31 = pMVar31 + 0xc;
    } while (sVar34 != sVar35);
    if (((*(uint *)&pMVar36->field_0x18 & 0xfffffffc) != 0) ||
       (*(char *)&pMVar36[1].insn_link.prev != '\x02')) goto LAB_00173458;
    pVVar28 = gen_ctx->combine_ctx->insn_vars;
    if (pVVar28 != (VARR_MIR_reg_t *)0x0) {
      if (pVVar28->els_num == 0) {
LAB_00173458:
        pVVar28 = gen_ctx->combine_ctx->insn_vars;
        if (pVVar28 == (VARR_MIR_reg_t *)0x0) {
LAB_00173929:
          combine_substitute_cold_8();
LAB_00173931:
          combine_substitute_cold_7();
LAB_00173939:
          combine_substitute_cold_3();
LAB_00173941:
          __assert_fail("op_ref->mode != MIR_OP_VAR_MEM || (op_ref->u.var_mem.base != var && op_ref->u.var_mem.index != var)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x228a,"int combine_substitute(gen_ctx_t, bb_insn_t *, long *)");
        }
        pMVar26 = pMVar36->ops;
        local_c0 = local_c0 + (local_c0 == 0);
        local_80 = &pMVar36->ops[0].u.mem.index;
        uVar25 = 0;
        pgVar32 = gen_ctx;
LAB_0017348e:
        sVar35 = pVVar28->els_num;
        if (sVar35 != 0) {
          if (pVVar28->varr != (MIR_reg_t *)0x0) {
            pVVar28->els_num = sVar35 - 1;
            MVar6 = pVVar28->varr[sVar35 - 1];
            pMVar27 = get_uptodate_def_insn(pgVar32,MVar6);
            if ((pMVar27 != (MIR_insn_t)0x0) && ((*(uint *)&pMVar27->field_0x18 & 0xfffffffc) == 0))
            {
              local_78 = pMVar27 + 1;
              local_b0 = (bb_insn_t_conflict *)0x0;
              sVar35 = 0;
              pMVar31 = local_80;
              local_98 = pMVar26;
              local_90 = uVar25;
              local_70 = pgVar32;
              do {
                bb_insn_ref = (bb_insn_t_conflict *)pMVar36;
                MIR_insn_op_mode((MIR_context_t)local_88,pMVar36,sVar35,&local_cc);
                if (((local_cc == 0) && ((char)pMVar31[-7] == '\x02')) &&
                   (*(MIR_reg_t *)(pMVar31 + -5) == MVar6)) {
                  auVar3 = *(undefined1 (*) [32])local_78;
                  *(MIR_mem_t *)(pMVar31 + -5) = *(MIR_mem_t *)&(local_78->insn_link).next;
                  *(undefined1 (*) [32])(pMVar31 + -9) = auVar3;
                  local_b0 = (bb_insn_t_conflict *)&DAT_00000001;
                  bVar14 = false;
                }
                else {
                  bVar14 = true;
                  if (((char)pMVar31[-7] == '\v') && ((pMVar31[-1] == MVar6 || (*pMVar31 == MVar6)))
                     ) goto LAB_00173941;
                }
                if (!bVar14) {
                  pVVar10 = pgVar32->combine_ctx->changed_op_numbers;
                  gen_ctx = (gen_ctx_t)pVVar10->varr;
                  if (gen_ctx == (gen_ctx_t)0x0) goto LAB_00173978;
                  uVar25 = pVVar10->els_num + 1;
                  if (pVVar10->size < uVar25) {
                    sVar34 = (uVar25 >> 1) + uVar25;
                    psVar29 = (size_t *)realloc(gen_ctx,sVar34 * 8);
                    pVVar10->varr = psVar29;
                    pVVar10->size = sVar34;
                    pgVar32 = local_70;
                  }
                  sVar34 = pVVar10->els_num;
                  pVVar10->els_num = sVar34 + 1;
                  pVVar10->varr[sVar34] = sVar35;
                  pMVar36 = local_b8;
                }
                sVar35 = sVar35 + 1;
                pMVar31 = pMVar31 + 0xc;
              } while (local_c0 != sVar35);
              pMVar26 = local_98;
              uVar25 = local_90;
              if ((int)local_b0 != 0) {
                bb_insn_ref = (bb_insn_t_conflict *)pMVar36;
                gen_ctx = pgVar32;
                iVar23 = find_insn_pattern(pgVar32,pMVar36,(int *)0x0);
                pMVar26 = local_98;
                uVar25 = local_90 & 0xffffffff;
                if (-1 < iVar23) {
                  uVar25 = 1;
                }
                pcVar8 = pgVar32->combine_ctx;
                pVVar10 = pcVar8->changed_op_numbers;
                do {
                  if (pVVar10 == (VARR_size_t *)0x0) {
LAB_00173968:
                    combine_substitute_cold_6();
LAB_00173970:
                    combine_substitute_cold_5();
LAB_00173978:
                    combine_substitute_cold_2();
                    goto LAB_00173980;
                  }
                  bb_insn_ref = (bb_insn_t_conflict *)pVVar10->els_num;
                  if ((MIR_insn_t_conflict)bb_insn_ref == (MIR_insn_t_conflict)0x0)
                  goto LAB_00173710;
                  gen_ctx = (gen_ctx_t)pVVar10->varr;
                  if (gen_ctx == (gen_ctx_t)0x0) goto LAB_00173970;
                  pVVar10->els_num =
                       (size_t)((long)&((MIR_insn_t_conflict)((long)bb_insn_ref + -0x50))->ops[0].u
                               + 0x1f);
                  pVVar9 = gen_ctx->call_used_hard_regs
                           [(long)&((MIR_insn_t_conflict)((long)bb_insn_ref + -0x50))->ops[0].u.reg
                            + 0x12];
                  if (iVar23 < 0) {
                    bb_insn_ref = (bb_insn_t_conflict *)pcVar8->last_right_ops;
                    if ((((MIR_insn_t_conflict)bb_insn_ref == (MIR_insn_t_conflict)0x0) ||
                        (pMVar12 = ((anon_union_32_12_57d33f68_for_u *)
                                   &(((MIR_insn_t_conflict)bb_insn_ref)->insn_link).next)->label,
                        pMVar12 == (MIR_label_t)0x0)) ||
                       ((bitmap_t)((MIR_insn_t_conflict)bb_insn_ref)->data <= pVVar9)) {
                      combine_substitute_cold_4();
                      goto LAB_00173968;
                    }
                    paVar2 = (anon_union_32_12_57d33f68_for_u *)(local_98 + (long)pVVar9);
                    aVar4 = pMVar12->ops[(long)((long)&pVVar9[-1].varr + 7)].u;
                    gen_ctx = (gen_ctx_t)pMVar12->ops[(long)pVVar9].data;
                    paVar2[1].i = (int64_t)gen_ctx;
                    *(undefined8 *)((long)paVar2 + 0x28) =
                         *(undefined8 *)&pMVar12->ops[(long)pVVar9].field_0x8;
                    *paVar2 = aVar4;
                  }
                  else {
                    pVVar7 = pcVar8->last_right_ops;
                    if (((pVVar7 == (VARR_MIR_op_t *)0x0) ||
                        (pMVar11 = pVVar7->varr, pMVar11 == (MIR_op_t *)0x0)) ||
                       ((bitmap_t)pVVar7->els_num <= pVVar9)) goto LAB_00173939;
                    auVar3 = *(undefined1 (*) [32])(local_98 + (long)pVVar9);
                    *(undefined1 (*) [16])((long)&pMVar11[(long)pVVar9].u + 0x10) =
                         *(undefined1 (*) [16])((long)&local_98[(long)pVVar9].u + 0x10);
                    *(undefined1 (*) [32])(pMVar11 + (long)pVVar9) = auVar3;
                  }
                  bb_insn_ref = (bb_insn_t_conflict *)(local_98 + (long)pVVar9);
                  pcVar8 = pgVar32->combine_ctx;
                  pVVar10 = pcVar8->changed_op_numbers;
                } while( true );
              }
            }
            goto LAB_001734d0;
          }
          goto LAB_00173931;
        }
        goto LAB_001731a4;
      }
      if (pVVar28->varr != (MIR_reg_t *)0x0) {
        MVar6 = *(MIR_reg_t *)&pMVar36[1].insn_link.next;
        if (pVVar28->varr[pVVar28->els_num - 1] == MVar6) {
          pMVar27 = get_uptodate_def_insn(gen_ctx,MVar6);
          uVar25 = 0;
          if ((pMVar27 != (MIR_insn_t)0x0) &&
             (uVar24 = *(uint *)&pMVar27->field_0x18, uVar24 - 0xaa < 0xfffffffd)) {
            target_get_early_clobbered_hard_regs(pMVar27,&local_a4,&local_a8);
            pMVar36 = local_b8;
            if ((((uVar24 < 4) ||
                 (((local_a4 != 0xffffffff || (local_a8 != 0xffffffff)) ||
                  (*(char *)&local_b8[1].insn_link.prev != '\x02')))) ||
                (*(MIR_reg_t *)&local_b8[1].insn_link.next != MVar6)) ||
               ((local_b8->ops[0].field_0x8 == '\v' &&
                ((local_b8->ops[0].u.mem.base == MVar6 || (local_b8->ops[0].u.mem.index == MVar6))))
               )) goto LAB_00173458;
            pMVar26 = local_b8->ops;
            pvStack_68 = pMVar27->ops[0].data;
            uStack_60 = *(undefined8 *)&pMVar27->ops[0].field_0x8;
            local_58 = pMVar27->ops[0].u.i;
            pcStack_50 = pMVar27->ops[0].u.str.s;
            uStack_48 = *(undefined8 *)((long)&pMVar27->ops[0].u + 0x10);
            MStack_40 = pMVar27->ops[0].u.mem.disp;
            pvVar15 = pMVar26->data;
            uVar16 = *(undefined8 *)&local_b8->ops[0].field_0x8;
            iVar17 = local_b8->ops[0].u.i;
            pcVar18 = local_b8->ops[0].u.str.s;
            pcVar19 = local_b8->ops[0].u.str.s;
            uVar20 = *(undefined8 *)((long)&local_b8->ops[0].u + 0x10);
            MVar21 = local_b8->ops[0].u.mem.disp;
            pMVar27->ops[0].u.i = local_b8->ops[0].u.i;
            pMVar27->ops[0].u.str.s = pcVar19;
            *(undefined8 *)((long)&pMVar27->ops[0].u + 0x10) = uVar20;
            pMVar27->ops[0].u.mem.disp = MVar21;
            pMVar27->ops[0].data = pvVar15;
            *(undefined8 *)&pMVar27->ops[0].field_0x8 = uVar16;
            pMVar27->ops[0].u.i = iVar17;
            pMVar27->ops[0].u.str.s = pcVar18;
            uVar25 = 0;
            iVar23 = find_insn_pattern(gen_ctx,pMVar27,(int *)0x0);
            ppbVar22 = local_b0;
            insn = local_b8;
            pMVar27->ops[0].data = pvStack_68;
            *(undefined8 *)&pMVar27->ops[0].field_0x8 = uStack_60;
            pMVar27->ops[0].u.i = local_58;
            pMVar27->ops[0].u.str.s = pcStack_50;
            pMVar27->ops[0].u.i = local_58;
            pMVar27->ops[0].u.str.s = pcStack_50;
            *(undefined8 *)((long)&pMVar27->ops[0].u + 0x10) = uStack_48;
            pMVar27->ops[0].u.mem.disp = MStack_40;
            if (-1 < iVar23) {
              gen_move_insn_before(gen_ctx,local_b8,pMVar27);
              if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                fwrite("      moving insn ",0x12,1,(FILE *)gen_ctx->debug_file);
                print_bb_insn(gen_ctx,(bb_insn_t_conflict)pMVar27->data,0);
                fwrite("      before insn ",0x12,1,(FILE *)gen_ctx->debug_file);
                print_bb_insn(gen_ctx,local_c8,1);
              }
              pvVar15 = pMVar26->data;
              uVar16 = *(undefined8 *)&pMVar36->ops[0].field_0x8;
              iVar17 = pMVar36->ops[0].u.i;
              pcVar18 = pMVar36->ops[0].u.str.s;
              pcVar19 = pMVar36->ops[0].u.str.s;
              uVar20 = *(undefined8 *)((long)&pMVar36->ops[0].u + 0x10);
              MVar21 = pMVar36->ops[0].u.mem.disp;
              pMVar27->ops[0].u.i = pMVar36->ops[0].u.i;
              pMVar27->ops[0].u.str.s = pcVar19;
              *(undefined8 *)((long)&pMVar27->ops[0].u + 0x10) = uVar20;
              pMVar27->ops[0].u.mem.disp = MVar21;
              pMVar27->ops[0].data = pvVar15;
              *(undefined8 *)&pMVar27->ops[0].field_0x8 = uVar16;
              pMVar27->ops[0].u.i = iVar17;
              pMVar27->ops[0].u.str.s = pcVar18;
              if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                fwrite("      changing it to ",0x15,1,(FILE *)gen_ctx->debug_file);
                print_bb_insn(gen_ctx,(bb_insn_t_conflict)pMVar27->data,1);
                fwrite("      deleting insn ",0x14,1,(FILE *)gen_ctx->debug_file);
                print_bb_insn(gen_ctx,local_c8,1);
              }
              gen_delete_insn(gen_ctx,insn);
              *local_a0 = *local_a0 + 1;
              *ppbVar22 = (bb_insn_t_conflict)pMVar27->data;
              uVar25 = 1;
            }
          }
LAB_001731a4:
          return (int)uVar25;
        }
        goto LAB_00173458;
      }
      goto LAB_0017399a;
    }
  }
  combine_substitute_cold_9();
LAB_0017399a:
  combine_substitute_cold_1();
  if ((int)__size != -1) {
    pcVar8 = pgVar32->combine_ctx;
    if (pcVar8->var_ref_ages == (VARR_size_t *)0x0) {
      safe_var_substitution_p_cold_1();
      if (cStack_d0 == '\v') {
        if (((MIR_reg_t)local_b8 != 0xffffffff) &&
           (iVar23 = obsolete_var_p(pgVar32,(MIR_reg_t)local_b8,(size_t)__size), iVar23 != 0)) {
          return 1;
        }
        if ((local_b8._4_4_ != 0xffffffff) &&
           (iVar23 = obsolete_var_p(pgVar32,local_b8._4_4_,(size_t)__size), iVar23 != 0)) {
          return 1;
        }
        uVar24 = (uint)(__size < (MIR_insn_t_conflict)pgVar32->combine_ctx->last_mem_ref_insn_num);
      }
      else {
        uVar24 = 0;
        if (cStack_d0 == '\x02') {
          iVar23 = obsolete_var_p(pgVar32,(MIR_reg_t)local_c8,(size_t)__size);
          uVar24 = 1;
          if (iVar23 == 0) {
            uVar24 = 0;
          }
        }
      }
      return uVar24;
    }
    uVar25 = (ulong)__size & 0xffffffff;
    if (((uVar25 < pcVar8->var_ref_ages->els_num) &&
        (pcVar8->var_ref_ages_addr[uVar25] == pcVar8->curr_bb_var_ref_age)) &&
       (pcVar8->var_refs_addr[uVar25].def_p != '\0')) {
      for (piVar30 = *(int **)(extraout_RDX + 0x38); piVar30 != (int *)0x0;
          piVar30 = *(int **)(piVar30 + 4)) {
        if (*piVar30 == (int)__size) {
          return 1;
        }
      }
    }
  }
  return 0;
LAB_00173710:
  if (-1 < iVar23) {
    iVar23 = combine_delete_insn(pgVar32,pMVar27,local_c8);
    if (iVar23 != 0) {
      *local_a0 = *local_a0 + 1;
    }
    if (((FILE *)pgVar32->debug_file != (FILE *)0x0) && (1 < pgVar32->debug_level)) {
      fwrite("      changing to ",0x12,1,(FILE *)pgVar32->debug_file);
      print_bb_insn(pgVar32,local_c8,1);
    }
  }
LAB_001734d0:
  pVVar28 = pgVar32->combine_ctx->insn_vars;
  if (pVVar28 == (VARR_MIR_reg_t *)0x0) goto LAB_00173929;
  goto LAB_0017348e;
}

Assistant:

static int combine_substitute (gen_ctx_t gen_ctx, bb_insn_t *bb_insn_ref, long *deleted_insns_num) {
  MIR_context_t ctx = gen_ctx->ctx;
  bb_insn_t bb_insn = *bb_insn_ref;
  MIR_insn_t insn = bb_insn->insn, def_insn;
  size_t i, nops = insn->nops;
  int out_p, insn_change_p, insn_var_change_p, op_change_p, success_p;
  MIR_op_t *op_ref, saved_op;
  MIR_reg_t var, early_clobbered_hard_reg1, early_clobbered_hard_reg2;

  if (nops == 0) return FALSE;
  VARR_TRUNC (MIR_op_t, last_right_ops, 0);
  for (i = 0; i < nops; i++) VARR_PUSH (MIR_op_t, last_right_ops, insn->ops[i]);
  VARR_TRUNC (MIR_reg_t, insn_vars, 0);
  bitmap_clear (vars_bitmap);
  for (i = 0; i < nops; i++) {
    MIR_insn_op_mode (ctx, insn, i, &out_p);
    if (out_p || insn->ops[i].mode == MIR_OP_VAR_MEM) continue;
    combine_process_op (gen_ctx, &insn->ops[i], bb_insn);
  }

  if (move_code_p (insn->code) && insn->ops[1].mode == MIR_OP_VAR
      && VARR_LENGTH (MIR_reg_t, insn_vars) != 0
      && VARR_LAST (MIR_reg_t, insn_vars) == insn->ops[1].u.var) {
    /* We can change move src.  Try to change insn the following way:
       r0 = r2 op r3; ...; ... = r0  =>  ...; ... = r2 op r3 */
    var = insn->ops[1].u.var;
    if ((def_insn = get_uptodate_def_insn (gen_ctx, var)) == NULL
        || MIR_call_code_p (def_insn->code))
      return FALSE;
    target_get_early_clobbered_hard_regs (def_insn, &early_clobbered_hard_reg1,
                                          &early_clobbered_hard_reg2);
    if (!move_code_p (def_insn->code) && early_clobbered_hard_reg1 == MIR_NON_VAR
        && early_clobbered_hard_reg2 == MIR_NON_VAR && insn->ops[1].mode == MIR_OP_VAR
        && insn->ops[1].u.var == var
        /* Check that insn->ops[0] is not mem[...hr0...]: */
        && (insn->ops[0].mode != MIR_OP_VAR_MEM
            || (insn->ops[0].u.var_mem.base != var && insn->ops[0].u.var_mem.index != var))) {
      saved_op = def_insn->ops[0];
      def_insn->ops[0] = insn->ops[0];
      success_p = target_insn_ok_p (gen_ctx, def_insn);
      def_insn->ops[0] = saved_op;
      if (!success_p) return FALSE;
      gen_move_insn_before (gen_ctx, insn, def_insn);
      DEBUG (2, {
        fprintf (debug_file, "      moving insn ");
        print_bb_insn (gen_ctx, def_insn->data, FALSE);
        fprintf (debug_file, "      before insn ");
        print_bb_insn (gen_ctx, bb_insn, TRUE);
      });
      def_insn->ops[0] = insn->ops[0];
      DEBUG (2, {
        fprintf (debug_file, "      changing it to ");
        print_bb_insn (gen_ctx, def_insn->data, TRUE);
        fprintf (debug_file, "      deleting insn ");
        print_bb_insn (gen_ctx, bb_insn, TRUE);
      });
      gen_delete_insn (gen_ctx, insn);
      (*deleted_insns_num)++;
      *bb_insn_ref = def_insn->data;
      return TRUE;
    }
  }
  insn_change_p = FALSE;
  while (VARR_LENGTH (MIR_reg_t, insn_vars) != 0) {
    var = VARR_POP (MIR_reg_t, insn_vars);
    if ((def_insn = get_uptodate_def_insn (gen_ctx, var)) == NULL) continue;
    if (!move_code_p (def_insn->code)) continue;
    insn_var_change_p = FALSE;
    for (i = 0; i < nops; i++) { /* Change all var occurences: */
      op_ref = &insn->ops[i];
      op_change_p = FALSE;
      MIR_insn_op_mode (ctx, insn, i, &out_p);
      if (!out_p && op_ref->mode == MIR_OP_VAR && op_ref->u.var == var) {
        /* It is not safe to substitute if there is another use after def insn before
           the current as we delete def insn after substitution. */
        insn->ops[i] = def_insn->ops[1];
        insn_var_change_p = op_change_p = TRUE;
      } else {
        gen_assert (op_ref->mode != MIR_OP_VAR_MEM
                    || (op_ref->u.var_mem.base != var && op_ref->u.var_mem.index != var));
      }
      if (op_change_p) VARR_PUSH (size_t, changed_op_numbers, i);
    }
    if (insn_var_change_p) {
      if ((success_p = i >= nops && target_insn_ok_p (gen_ctx, insn))) insn_change_p = TRUE;
      while (VARR_LENGTH (size_t, changed_op_numbers)) {
        i = VARR_POP (size_t, changed_op_numbers);
        if (success_p)
          VARR_SET (MIR_op_t, last_right_ops, i, insn->ops[i]);
        else
          insn->ops[i] = VARR_GET (MIR_op_t, last_right_ops, i); /* restore changed operands */
      }
      if (success_p) {
        gen_assert (def_insn != NULL);
        if (combine_delete_insn (gen_ctx, def_insn, bb_insn)) (*deleted_insns_num)++;
        DEBUG (2, {
          fprintf (debug_file, "      changing to ");
          print_bb_insn (gen_ctx, bb_insn, TRUE);
        });
      }
    }
  }
  return insn_change_p;
}